

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue js_string_iterator_next
                  (JSContext *ctx,JSValue this_val,int argc,JSValue *argv,BOOL *pdone,int magic)

{
  JSValue v;
  int iVar1;
  uint uVar2;
  JSValue *pJVar3;
  undefined4 *in_R9;
  JSValue JVar4;
  JSString *p;
  uint32_t start;
  uint32_t c;
  uint32_t idx;
  JSArrayIteratorData *it;
  uint16_t in_stack_ffffffffffffff8e;
  undefined4 in_stack_ffffffffffffff90;
  uint in_stack_ffffffffffffff94;
  undefined4 in_stack_ffffffffffffff98;
  JSClassID in_stack_ffffffffffffff9c;
  JSContext *in_stack_ffffffffffffffa0;
  JSContext *ctx_00;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb4;
  uint uVar5;
  JSValueUnion local_10;
  int64_t local_8;
  
  JVar4.u._4_4_ = in_stack_ffffffffffffffac;
  JVar4.u.int32 = in_stack_ffffffffffffffa8;
  JVar4.tag._0_4_ = in_stack_ffffffffffffffb0;
  JVar4.tag._4_4_ = in_stack_ffffffffffffffb4;
  pJVar3 = (JSValue *)JS_GetOpaque2(in_stack_ffffffffffffffa0,JVar4,in_stack_ffffffffffffff9c);
  if (pJVar3 == (JSValue *)0x0) {
    *in_R9 = 0;
    local_10.ptr = (void *)(local_10 << 0x20);
    local_8 = 6;
  }
  else {
    iVar1 = JS_IsUndefined(*pJVar3);
    if (iVar1 == 0) {
      ctx_00 = (JSContext *)(pJVar3->u).ptr;
      uVar5 = *(uint *)((long)&pJVar3[1].u + 4);
      if (uVar5 < ((uint)*(undefined8 *)&(ctx_00->header).field_0x4 & 0x7fffffff)) {
        uVar2 = string_getc((JSString *)ctx_00,(int *)&stack0xffffffffffffffb4);
        *(uint *)((long)&pJVar3[1].u + 4) = uVar5;
        *in_R9 = 0;
        if (uVar2 < 0x10000) {
          JVar4 = js_new_string_char((JSContext *)
                                     CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                                     in_stack_ffffffffffffff8e);
          return JVar4;
        }
        JVar4 = js_new_string16(ctx_00,(uint16_t *)
                                       CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98)
                                ,in_stack_ffffffffffffff94);
        return JVar4;
      }
      v.u._4_4_ = in_stack_ffffffffffffff9c;
      v.u.int32 = in_stack_ffffffffffffff98;
      v.tag = (int64_t)ctx_00;
      JS_FreeValue((JSContext *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),v);
      (pJVar3->u).ptr = (void *)((ulong)in_stack_ffffffffffffff94 << 0x20);
      pJVar3->tag = 3;
    }
    *in_R9 = 1;
    local_10.ptr = (void *)(local_10 << 0x20);
    local_8 = 3;
  }
  return _local_10;
}

Assistant:

static JSValue js_string_iterator_next(JSContext *ctx, JSValueConst this_val,
                                       int argc, JSValueConst *argv,
                                       BOOL *pdone, int magic)
{
    JSArrayIteratorData *it;
    uint32_t idx, c, start;
    JSString *p;

    it = JS_GetOpaque2(ctx, this_val, JS_CLASS_STRING_ITERATOR);
    if (!it) {
        *pdone = FALSE;
        return JS_EXCEPTION;
    }
    if (JS_IsUndefined(it->obj))
        goto done;
    p = JS_VALUE_GET_STRING(it->obj);
    idx = it->idx;
    if (idx >= p->len) {
        JS_FreeValue(ctx, it->obj);
        it->obj = JS_UNDEFINED;
    done:
        *pdone = TRUE;
        return JS_UNDEFINED;
    }

    start = idx;
    c = string_getc(p, (int *)&idx);
    it->idx = idx;
    *pdone = FALSE;
    if (c <= 0xffff) {
        return js_new_string_char(ctx, c);
    } else {
        return js_new_string16(ctx, p->u.str16 + start, 2);
    }
}